

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void fornum(LexState *ls,TString *varname,int line)

{
  byte bVar1;
  byte bVar2;
  FuncState *fs_00;
  int iVar3;
  int iVar4;
  LocVar *pLVar5;
  LocVar *pLVar6;
  LocVar *pLVar7;
  LocVar *pLVar8;
  LocVar *vvar;
  LocVar *vstep;
  LocVar *vlimit;
  LocVar *vidx;
  Fornuminfo *info;
  int iStack_50;
  Fornuminfo tstep;
  Fornuminfo tlimit;
  Fornuminfo tidx;
  int var_idx;
  int base;
  FuncState *fs;
  int line_local;
  TString *varname_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bVar1 = fs_00->freereg;
  new_localvarliteral_(ls,"(for index)",0xb);
  new_localvarliteral_(ls,"(for limit)",0xb);
  new_localvarliteral_(ls,"(for step)",10);
  new_localvar(ls,varname,0xffffffff,(TString *)0x0);
  iVar3 = (int)fs_00->nlocvars;
  checknext(ls,0x3d);
  tlimit.is_constant = -1;
  tlimit.int_value = 0;
  tstep.is_constant = -1;
  tstep.int_value = 0;
  tlimit.type_map = 0;
  stack0xffffffffffffffac = 8;
  tstep.type_map = 0;
  vidx = (LocVar *)0x0;
  exp1(ls,(Fornuminfo *)&tlimit.is_constant);
  checknext(ls,0x2c);
  exp1(ls,(Fornuminfo *)&tstep.is_constant);
  iVar4 = testnext(ls,0x2c);
  if (iVar4 == 0) {
    stack0xffffffffffffffac = CONCAT44(1,info._4_4_);
    tstep.type_map = 1;
    bVar2 = fs_00->freereg;
    iVar4 = luaK_intK(fs_00,1);
    luaK_codek(fs_00,(uint)bVar2,iVar4);
    luaK_reserveregs(fs_00,1);
  }
  else {
    exp1(ls,(Fornuminfo *)((long)&info + 4));
  }
  if (((tlimit.is_constant == tstep.is_constant) && (tstep.is_constant == info._4_4_)) &&
     ((tlimit.is_constant == 0x10 || (tlimit.is_constant == 8)))) {
    if ((tlimit.is_constant == 8) && (iStack_50 != 0)) {
      vidx = (LocVar *)((long)&info + 4);
    }
    pLVar5 = fs_00->f->locvars + (iVar3 + -4);
    pLVar6 = fs_00->f->locvars + (iVar3 + -3);
    pLVar7 = fs_00->f->locvars + (iVar3 + -2);
    pLVar8 = fs_00->f->locvars + (iVar3 + -1);
    pLVar8->ravi_type_map = tlimit.is_constant;
    pLVar7->ravi_type_map = tlimit.is_constant;
    pLVar6->ravi_type_map = tlimit.is_constant;
    pLVar5->ravi_type_map = tlimit.is_constant;
    if ((ravi_parser_debug & 4U) != 0) {
      raviY_printf(fs_00,"fornum -> setting type for index %v\n",pLVar5);
    }
    if ((ravi_parser_debug & 4U) != 0) {
      raviY_printf(fs_00,"fornum -> setting type for limit %v\n",pLVar6);
    }
    if ((ravi_parser_debug & 4U) != 0) {
      raviY_printf(fs_00,"fornum -> setting type for step %v\n",pLVar7);
    }
    if ((ravi_parser_debug & 4U) != 0) {
      raviY_printf(fs_00,"fornum -> setting type for variable %v\n",pLVar8);
    }
  }
  forbody(ls,(uint)bVar1,line,1,1,(Fornuminfo *)vidx);
  return;
}

Assistant:

static void fornum (LexState *ls, TString *varname, int line) {
  /* fornum -> NAME = exp1,exp1[,exp1] forbody */
  FuncState *fs = ls->fs;
  int base = fs->freereg;
  new_localvarliteral(ls, "(for index)");
  new_localvarliteral(ls, "(for limit)");
  new_localvarliteral(ls, "(for step)");
  new_localvar(ls, varname, RAVI_TM_ANY, NULL);
  /* The fornum sets up its own variables as above.
     These are expected to hold numeric values - but from Ravi's
     point of view we need to know if the variable is an integer or
     double. So we need to check if this can be determined from the
     fornum expressions. If we can then we will set the 
     fornum variables to the type we discover.
  */
  int var_idx = fs->nlocvars - 4; /* note location of idx variable */
  checknext(ls, '=');
  /* get the type of each expression */
  Fornuminfo tidx = { RAVI_TM_ANY,0,0 }, tlimit = { RAVI_TM_ANY,0,0 }, tstep = { RAVI_TM_INTEGER,0,0 };
  Fornuminfo *info = NULL;
  exp1(ls, &tidx);  /* initial value */
  checknext(ls, ',');
  exp1(ls, &tlimit);  /* limit */
  if (testnext(ls, ','))
    exp1(ls, &tstep);  /* optional step */
  else {  /* default step = 1 */
    tstep.is_constant = 1;
    tstep.int_value = 1;
    luaK_codek(fs, fs->freereg, luaK_intK(fs, 1));
    luaK_reserveregs(fs, 1);
  }
  if (tidx.type_map == tlimit.type_map && tlimit.type_map == tstep.type_map && 
     (tidx.type_map == RAVI_TM_FLOAT || tidx.type_map == RAVI_TM_INTEGER)) {
    LocVar *vidx, *vlimit, *vstep, *vvar;
    if (tidx.type_map == RAVI_TM_INTEGER && tstep.is_constant)
      info = &tstep;
    /* Note that as locvars may be reallocated while creating variables
       therefore we access the variables here */
    vidx = &fs->f->locvars[var_idx]; /* index variable - not yet active so get it from locvars*/
    vlimit = &fs->f->locvars[var_idx+1]; /* index variable - not yet active so get it from locvars*/
    vstep = &fs->f->locvars[var_idx+2]; /* index variable - not yet active so get it from locvars*/
    vvar = &fs->f->locvars[var_idx+3]; /* index variable - not yet active so get it from locvars*/
                                              /* Ok so we have an integer or double */
    vidx->ravi_type_map = vlimit->ravi_type_map = vstep->ravi_type_map = vvar->ravi_type_map = tidx.type_map;
    DEBUG_VARS(raviY_printf(fs, "fornum -> setting type for index %v\n", vidx));
    DEBUG_VARS(raviY_printf(fs, "fornum -> setting type for limit %v\n", vlimit));
    DEBUG_VARS(raviY_printf(fs, "fornum -> setting type for step %v\n", vstep));
    DEBUG_VARS(raviY_printf(fs, "fornum -> setting type for variable %v\n", vvar));
  }
  forbody(ls, base, line, 1, 1, info);
}